

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_StartLegacyConnectSyntaxSuccess_Test::TestBody
          (InterpreterTestSuite_PC_StartLegacyConnectSyntaxSuccess_Test *this)

{
  Registry *pRVar1;
  TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar2;
  char *expected_predicate_value;
  char *pcVar3;
  Status local_4e2;
  allocator local_4e1;
  allocator local_4e0;
  allocator local_4df;
  allocator local_4de;
  allocator local_4dd;
  allocator local_4dc;
  allocator local_4db;
  allocator local_4da;
  Status local_4d9;
  AssertionResult gtest_ar;
  Expression expr;
  State local_498;
  State local_494;
  string local_490;
  Value value;
  AssertionResult gtest_ar_;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_408;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3e8;
  _Any_data local_3c8 [4];
  string local_380;
  UnixTime local_360;
  UnixTime local_358;
  string local_350;
  string local_330;
  undefined1 local_310 [8];
  _Alloc_hider local_308;
  size_type local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  BorderRouter br;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  pRVar1 = ctx.mRegistry;
  std::__cxx11::string::string((string *)&value,"127.0.0.1",&local_4da);
  local_3e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_3c8[0]._M_pod_data,"1.1",&local_4db);
  ot::commissioner::BorderAgent::State::State(&local_494,0,0,0,0,0);
  std::__cxx11::string::string((string *)&expr,"net1",&local_4dc);
  std::__cxx11::string::string((string *)&gtest_ar_,"",&local_4dd);
  std::__cxx11::string::string((string *)&local_490,"",&local_4de);
  std::__cxx11::string::string((string *)&local_380,"",&local_4df);
  local_408._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_330,"domain1",&local_4e0);
  pcVar3 = "";
  std::__cxx11::string::string((string *)&local_350,"",&local_4e1);
  ot::commissioner::UnixTime::UnixTime(&local_358,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&br,(string *)&value,0x4e21,(ByteArray *)&local_3e8,(string *)local_3c8,
             local_494,(string *)&expr,1,(string *)&gtest_ar_,&local_490,(Timestamp)0x0,0,&local_380
             ,(ByteArray *)&local_408,&local_330,'\0',0,&local_350,local_358,0x103f);
  local_4d9 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&br);
  local_4e2 = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)&gtest_ar,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_4d9,&local_4e2);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_408);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&expr);
  std::__cxx11::string::~string((string *)local_3c8[0]._M_pod_data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e8);
  std::__cxx11::string::~string((string *)&value);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&br);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3fd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (br._vptr_BorderRouter != (_func_int **)0x0) {
      (**(code **)(*br._vptr_BorderRouter + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    pRVar1 = ctx.mRegistry;
    std::__cxx11::string::string((string *)&value,"127.0.0.2",&local_4da);
    local_3e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)local_3c8[0]._M_pod_data,"1.1",&local_4db);
    ot::commissioner::BorderAgent::State::State(&local_498,0,0,0,0,0);
    std::__cxx11::string::string((string *)&expr,"net2",&local_4dc);
    std::__cxx11::string::string((string *)&gtest_ar_,"",&local_4dd);
    std::__cxx11::string::string((string *)&local_490,"",&local_4de);
    std::__cxx11::string::string((string *)&local_380,"",&local_4df);
    local_408._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_408._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_408._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_330,"domain1",&local_4e0);
    pcVar3 = "";
    std::__cxx11::string::string((string *)&local_350,"",&local_4e1);
    ot::commissioner::UnixTime::UnixTime(&local_360,0);
    expected_predicate_value = (char *)(ulong)(uint)local_498;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&br,(string *)&value,0x4e21,(ByteArray *)&local_3e8,
               (string *)local_3c8,local_498,(string *)&expr,2,(string *)&gtest_ar_,&local_490,
               (Timestamp)0x0,0,&local_380,(ByteArray *)&local_408,&local_330,'\0',0,&local_350,
               local_360,0x103f);
    local_4d9 = ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&br);
    local_4e2 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&local_4d9,&local_4e2);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_330);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_408);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&expr);
    std::__cxx11::string::~string((string *)local_3c8[0]._M_pod_data);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e8);
    std::__cxx11::string::~string((string *)&value);
    if (gtest_ar.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
      ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&value,0);
      br.mNetworkId.mId = value.mError.mCode;
      local_3c8[0]._0_1_ =
           ot::commissioner::persistent_storage::Registry::SetCurrentNetwork(ctx.mRegistry,&br);
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)expr.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&value,"ctx.mRegistry->SetCurrentNetwork(br)",
                 "RegistryStatus::kSuccess",(Status *)local_3c8[0]._M_pod_data,(Status *)&expr);
      if ((undefined1)value.mError.mCode == kNone) {
        testing::Message::Message((Message *)local_3c8);
        if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)value.mError.mMessage._M_dataplus._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&expr,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x406,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)local_3c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
        if ((long *)CONCAT71(local_3c8[0]._1_7_,local_3c8[0]._M_pod_data[0]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_3c8[0]._1_7_,local_3c8[0]._M_pod_data[0]) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&value.mError.mMessage);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&value.mError.mMessage);
        testing::A<std::__cxx11::string_const&>();
        testing::A<unsigned_short>();
        CommissionerAppMock::gmock_Connect
                  ((MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                    *)&value,
                   ctx.mDefaultCommissionerObject.
                   super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)&expr,(Matcher<unsigned_short> *)&gtest_ar_);
        testing::internal::GetWithoutMatchers();
        pTVar2 = testing::internal::
                 MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                 ::InternalExpectedAt
                           ((MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                             *)&value,
                            "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                            ,0x408,"*ctx.mDefaultCommissionerObject","Connect(_, _)");
        pTVar2 = testing::internal::
                 TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                 ::Times(pTVar2,1);
        local_310._0_4_ = kNone;
        local_308._M_p = (pointer)&local_2f8;
        local_300 = 0;
        local_2f8._M_local_buf[0] = '\0';
        testing::Return<ot::commissioner::Error>((testing *)&local_490,(Error *)local_310);
        testing::internal::ReturnAction::operator_cast_to_Action
                  ((Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                    *)local_3c8,(ReturnAction *)&local_490);
        testing::internal::
        TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
        ::WillRepeatedly(pTVar2,(Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                 *)local_3c8);
        std::_Function_base::~_Function_base((_Function_base *)local_3c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_490._M_string_length);
        std::__cxx11::string::~string((string *)&local_308);
        std::
        _Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
        ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                        *)&value.mError.mMessage);
        testing::internal::MatcherBase<unsigned_short>::~MatcherBase
                  ((MatcherBase<unsigned_short> *)&gtest_ar_);
        testing::internal::
        MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&expr);
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        expr.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        value.mError.mCode = kNone;
        value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
        value.mError.mMessage._M_string_length = 0;
        value.mError.mMessage.field_2._M_local_buf[0] = '\0';
        value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
        value.mData._M_string_length = 0;
        value.mData.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string
                  ((string *)local_3c8[0]._M_pod_data,"start 127.0.0.1 20001 --connect-only",
                   (allocator *)&local_490);
        ot::commissioner::Interpreter::ParseExpression
                  ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_3c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&expr,&gtest_ar_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
        std::__cxx11::string::~string((string *)local_3c8[0]._M_pod_data);
        ot::commissioner::Interpreter::Eval((Value *)local_3c8,&ctx.mInterpreter,&expr);
        ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_3c8);
        ot::commissioner::Interpreter::Value::~Value((Value *)local_3c8);
        gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_490);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_3c8,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false",
                     "true",expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_380,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0x40e,(char *)CONCAT71(local_3c8[0]._1_7_,local_3c8[0]._M_pod_data[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_380,(Message *)&local_490);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_380);
          std::__cxx11::string::~string((string *)local_3c8[0]._M_pod_data);
          if ((long *)local_490._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_490._M_dataplus._M_p + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        ot::commissioner::Interpreter::Value::~Value(&value);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&expr);
      }
      ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&br);
      goto LAB_00152779;
    }
    testing::Message::Message((Message *)&br);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x402,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (br._vptr_BorderRouter != (_func_int **)0x0) {
      (**(code **)(*br._vptr_BorderRouter + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
LAB_00152779:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_StartLegacyConnectSyntaxSuccess)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, Connect(_, _)).Times(1).WillRepeatedly(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;
    expr  = ctx.mInterpreter.ParseExpression("start 127.0.0.1 20001 --connect-only");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}